

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  uint *puVar25;
  ulong uVar26;
  void *pvVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  undefined4 uVar31;
  void *pvVar32;
  undefined2 *puVar33;
  void *pvVar34;
  void *pvVar35;
  undefined2 *puVar36;
  long lVar37;
  int k_1;
  void *pvVar38;
  undefined2 *puVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  void *pvVar43;
  void *pvVar44;
  undefined2 *puVar45;
  short tmp [6] [3];
  void *local_128;
  void *local_120;
  ulong local_118;
  void *local_108;
  Mat local_b8;
  ulong local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar40 = (ulong)(uint)outch;
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  Mat::create(&local_b8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar44 = kernel->data;
    local_108 = local_b8.data;
    local_118 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_118;
        uVar20 = 0;
        pvVar23 = local_108;
        do {
          lVar42 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar44 + lVar42 + iVar18);
          cVar2 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 8);
          lVar42 = 4;
          do {
            sVar10 = *(short *)(&UNK_005536bc + lVar42);
            sVar11 = *(short *)(&UNK_005536be + lVar42);
            sVar12 = *(short *)((long)&DAT_005536c0 + lVar42);
            *(short *)((long)&local_60 + lVar42 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar42 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar42 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar42 = lVar42 + 6;
          } while (lVar42 != 0x28);
          lVar42 = 0;
          pvVar19 = pvVar23;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar42 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar42 * 6);
            puVar25 = &DAT_005536c2;
            lVar28 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar25),ZEXT416(uVar13));
              uVar31 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar28 * 2) =
                   (short)uVar31 + auVar16._0_2_ + *(short *)((long)puVar25 + -2) * sVar10;
              lVar28 = lVar28 + 1;
              puVar25 = (uint *)((long)puVar25 + 6);
            } while (lVar28 != 6);
            lVar42 = lVar42 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar42 != 6);
          uVar20 = uVar20 + 1;
          pvVar23 = (void *)((long)pvVar23 + (long)local_b8.w * local_b8.elemsize);
        } while (uVar20 != (uint)inch);
      }
      local_118 = local_118 + 1;
      local_108 = (void *)((long)local_108 + local_b8.cstep * local_b8.elemsize);
    } while (local_118 != uVar40);
  }
  iVar18 = outch + 3;
  if (-1 < outch) {
    iVar18 = outch;
  }
  local_68 = uVar40;
  Mat::create(kernel_tm,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
  uVar20 = 0;
  if (3 < outch) {
    lVar28 = local_b8.cstep * local_b8.elemsize;
    iVar18 = kernel_tm->w;
    pvVar23 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    pvVar21 = (void *)(lVar28 * 3 + (long)local_b8.data);
    local_60 = lVar28 * 4;
    lVar42 = (long)local_b8.w * local_b8.elemsize * 8;
    pvVar44 = (void *)((long)local_b8.data + lVar28 * 2);
    pvVar34 = (void *)(lVar28 + (long)local_b8.data);
    uVar26 = 0;
    pvVar19 = local_b8.data;
    do {
      lVar28 = 0;
      pvVar32 = pvVar21;
      pvVar43 = pvVar44;
      local_128 = pvVar34;
      local_120 = pvVar19;
      do {
        if (7 < inch) {
          lVar29 = (long)pvVar23 + (long)iVar18 * sVar14 * lVar28 + (uVar26 >> 2) * sVar15 * sVar14;
          pvVar22 = local_120;
          lVar24 = 0;
          pvVar27 = local_128;
          pvVar35 = pvVar32;
          pvVar38 = pvVar43;
          do {
            lVar37 = 0;
            lVar41 = 0;
            do {
              *(undefined2 *)(lVar29 + lVar41) = *(undefined2 *)((long)pvVar22 + lVar37);
              *(undefined2 *)(lVar29 + lVar41 + 2) = *(undefined2 *)((long)pvVar27 + lVar37);
              *(undefined2 *)(lVar29 + lVar41 + 4) = *(undefined2 *)((long)pvVar38 + lVar37);
              *(undefined2 *)(lVar29 + lVar41 + 6) = *(undefined2 *)((long)pvVar35 + lVar37);
              lVar41 = lVar41 + 8;
              lVar37 = lVar37 + (long)local_b8.w * local_b8.elemsize;
            } while (lVar41 != 0x40);
            lVar37 = lVar24 + 0xf;
            pvVar35 = (void *)((long)pvVar35 + lVar42);
            pvVar38 = (void *)((long)pvVar38 + lVar42);
            pvVar27 = (void *)((long)pvVar27 + lVar42);
            pvVar22 = (void *)((long)pvVar22 + lVar42);
            lVar29 = lVar29 + 0x40;
            lVar24 = lVar24 + 8;
          } while (lVar37 < inch);
        }
        lVar28 = lVar28 + 1;
        pvVar32 = (void *)((long)pvVar32 + 2);
        pvVar43 = (void *)((long)pvVar43 + 2);
        local_128 = (void *)((long)local_128 + 2);
        local_120 = (void *)((long)local_120 + 2);
      } while (lVar28 != 0x24);
      uVar20 = uVar26 + 4;
      uVar30 = uVar26 + 7;
      pvVar21 = (void *)((long)pvVar21 + local_60);
      pvVar44 = (void *)((long)pvVar44 + local_60);
      pvVar34 = (void *)((long)pvVar34 + local_60);
      pvVar19 = (void *)((long)pvVar19 + local_60);
      uVar26 = uVar20;
    } while (uVar30 < uVar40);
    outch = (int)local_68;
  }
  if ((int)uVar20 < outch) {
    iVar18 = kernel_tm->w;
    pvVar44 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    uVar20 = uVar20 & 0xffffffff;
    puVar33 = (undefined2 *)(local_b8.cstep * local_b8.elemsize * uVar20 + (long)local_b8.data);
    do {
      lVar42 = 0;
      puVar36 = puVar33;
      do {
        if (7 < inch) {
          lVar24 = (long)pvVar44 +
                   (long)iVar18 * sVar14 * lVar42 +
                   (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                   sVar15 * sVar14;
          lVar28 = 0;
          puVar45 = puVar36;
          do {
            lVar29 = 0;
            puVar39 = puVar45;
            do {
              *(undefined2 *)(lVar24 + lVar29) = *puVar39;
              puVar39 = (undefined2 *)((long)puVar39 + (long)local_b8.w * local_b8.elemsize);
              lVar29 = lVar29 + 2;
            } while (lVar29 != 0x10);
            lVar29 = lVar28 + 0xf;
            puVar45 = puVar45 + (long)local_b8.w * local_b8.elemsize * 4;
            lVar24 = lVar24 + 0x10;
            lVar28 = lVar28 + 8;
          } while (lVar29 < inch);
        }
        lVar42 = lVar42 + 1;
        puVar36 = puVar36 + 1;
      } while (lVar42 != 0x24);
      uVar20 = uVar20 + 1;
      puVar33 = (undefined2 *)((long)puVar33 + local_b8.cstep * local_b8.elemsize);
    } while (uVar20 != uVar40);
  }
  piVar17 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}